

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

bool __thiscall AActor::CheckLocalView(AActor *this,int playernum)

{
  AActor *pAVar1;
  bool bVar2;
  AActor **obj;
  
  obj = (AActor **)(&DAT_017dc0f8 + (long)playernum * 0x54);
  pAVar1 = GC::ReadBarrier<AActor>(obj);
  bVar2 = true;
  if ((pAVar1 != this) &&
     (((((AActor *)(&players)[(long)playernum * 0x54] != this ||
        (pAVar1 = GC::ReadBarrier<AActor>(obj), pAVar1 == (AActor *)0x0)) ||
       (pAVar1 = GC::ReadBarrier<AActor>(obj), pAVar1->player != (player_t *)0x0)) ||
      (pAVar1 = GC::ReadBarrier<AActor>(obj), ((pAVar1->flags3).Value & 0x2000) != 0)))) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool AActor::CheckLocalView (int playernum) const
{
	if (players[playernum].camera == this)
	{
		return true;
	}
	if (players[playernum].mo != this || players[playernum].camera == NULL)
	{
		return false;
	}
	if (players[playernum].camera->player == NULL &&
		!(players[playernum].camera->flags3 & MF3_ISMONSTER))
	{
		return true;
	}
	return false;
}